

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O0

bool __thiscall
Assimp::ObjExporter::vertexDataCompare::operator()
          (vertexDataCompare *this,vertexData *a,vertexData *b)

{
  float *pfVar1;
  ai_real *paVar2;
  float fVar3;
  vertexData *b_local;
  vertexData *a_local;
  vertexDataCompare *this_local;
  
  if ((b->vp).x <= (a->vp).x) {
    fVar3 = (a->vp).x;
    if (fVar3 < (b->vp).x || fVar3 == (b->vp).x) {
      if ((b->vp).y <= (a->vp).y) {
        fVar3 = (a->vp).y;
        pfVar1 = &(b->vp).y;
        if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
          if ((b->vp).z <= (a->vp).z) {
            fVar3 = (a->vp).z;
            pfVar1 = &(b->vp).z;
            if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
              if ((b->vc).r <= (a->vc).r) {
                fVar3 = (a->vc).r;
                if (fVar3 < (b->vc).r || fVar3 == (b->vc).r) {
                  if ((b->vc).g <= (a->vc).g) {
                    fVar3 = (a->vc).g;
                    paVar2 = &(b->vc).g;
                    if (fVar3 < *paVar2 || fVar3 == *paVar2) {
                      if ((b->vc).b <= (a->vc).b) {
                        fVar3 = (a->vc).b;
                        paVar2 = &(b->vc).b;
                        if (fVar3 < *paVar2 || fVar3 == *paVar2) {
                          this_local._7_1_ = false;
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = true;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = true;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() ( const vertexData& a, const vertexData& b ) const {
            // position
            if (a.vp.x < b.vp.x) return true;
            if (a.vp.x > b.vp.x) return false;
            if (a.vp.y < b.vp.y) return true;
            if (a.vp.y > b.vp.y) return false;
            if (a.vp.z < b.vp.z) return true;
            if (a.vp.z > b.vp.z) return false;

            // color
            if (a.vc.r < b.vc.r) return true;
            if (a.vc.r > b.vc.r) return false;
            if (a.vc.g < b.vc.g) return true;
            if (a.vc.g > b.vc.g) return false;
            if (a.vc.b < b.vc.b) return true;
            if (a.vc.b > b.vc.b) return false;
            return false;
        }